

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libSupport.c
# Opt level: O3

void call_inits(Abc_Frame_t *pAbc)

{
  code *pcVar1;
  void *pvVar2;
  ulong uVar3;
  
  if (libHandles[0] != (void *)0x0) {
    uVar3 = 0;
    pvVar2 = libHandles[0];
    do {
      pcVar1 = (code *)dlsym(pvVar2,"abc_init");
      if (pcVar1 == (code *)0x0) {
        printf("Warning: Failed to initialize library %d.\n",uVar3 & 0xffffffff);
      }
      else {
        (*pcVar1)(pAbc);
      }
      pvVar2 = libHandles[uVar3 + 1];
      uVar3 = uVar3 + 1;
    } while (pvVar2 != (void *)0x0);
  }
  return;
}

Assistant:

void call_inits(Abc_Frame_t* pAbc) {
    int i;
    lib_init_end_func init_func;
    for (i = 0; libHandles[i] != 0; i++) {
        init_func = (lib_init_end_func) get_fnct_ptr(i, "abc_init");
        if (init_func == 0) {
            printf("Warning: Failed to initialize library %d.\n", i);
        } else {
            (*init_func)(pAbc);
        }
    }
}